

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minicrypto.c
# Opt level: O0

void test_secp256r1_sign(void)

{
  int iVar1;
  uECC_Curve curve;
  uint16_t local_2ca;
  ptls_iovec_t local_2c8;
  undefined1 local_2b8 [8];
  uint32_t sigbuf_small [128];
  undefined1 local_b0 [8];
  ptls_buffer_t sigbuf;
  uint8_t local_88 [6];
  uint16_t selected;
  uint8_t pub [65];
  ptls_sign_certificate_t local_38;
  ptls_minicrypto_secp256r1sha256_sign_certificate_t signer;
  char *msg;
  
  signer.key._24_8_ = anon_var_dwarf_10ab2;
  memcpy(&local_38,&PTR_secp256r1sha256_sign_00142da8,0x28);
  curve = uECC_secp256r1();
  uECC_make_key(local_88,(uint8_t *)&signer,curve);
  ptls_buffer_init((ptls_buffer_t *)local_b0,local_2b8,0x200);
  local_2c8 = ptls_iovec_init((void *)signer.key._24_8_,0x20);
  local_2ca = 0x403;
  iVar1 = secp256r1sha256_sign
                    (&local_38,(ptls_t *)0x0,(uint16_t *)&sigbuf.field_0x1e,
                     (ptls_buffer_t *)local_b0,local_2c8,&local_2ca,1);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x3a);
  _ok((uint)(sigbuf._30_2_ == 0x403),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x3b);
  ptls_buffer_dispose((ptls_buffer_t *)local_b0);
  return;
}

Assistant:

static void test_secp256r1_sign(void)
{
    const char *msg = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdef";
    ptls_minicrypto_secp256r1sha256_sign_certificate_t signer = {{secp256r1sha256_sign}};
    uint8_t pub[SECP256R1_PUBLIC_KEY_SIZE];
    uint16_t selected;
    ptls_buffer_t sigbuf;
    uint32_t sigbuf_small[128];

    uECC_make_key(pub, signer.key, uECC_secp256r1());
    ptls_buffer_init(&sigbuf, sigbuf_small, sizeof(sigbuf_small));

    ok(secp256r1sha256_sign(&signer.super, NULL, &selected, &sigbuf, ptls_iovec_init(msg, 32),
                            (uint16_t[]){PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256}, 1) == 0);
    ok(selected == PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256);

    /* FIXME verify sign */

    ptls_buffer_dispose(&sigbuf);
}